

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_array.cpp
# Opt level: O0

void __thiscall VertexArray::VertexArray(VertexArray *this)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  VertexArray *pVVar1;
  VertexArray *this_local;
  
  this->binding_index = 0;
  std::vector<std::shared_ptr<VertexBuffer>,_std::allocator<std::shared_ptr<VertexBuffer>_>_>::
  vector(&this->m_vertexBuffers);
  std::shared_ptr<IndexBuffer>::shared_ptr(&this->m_indexBuffer,(nullptr_t)0x0);
  pVVar1 = this;
  (*glad_glGenVertexArrays)(1,&this->m_id);
  bind(this,(int)pVVar1,__addr,in_ECX);
  return;
}

Assistant:

VertexArray::VertexArray()
  : m_indexBuffer(nullptr)
{
#if OPENGL_VERSION >= 45
    glCreateVertexArrays(1, &m_id);
#else
    glGenVertexArrays(1, &m_id);
    bind();
#endif

    DERR("VAO default CONSTR: " << m_id);
}